

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O2

void __thiscall
PersistentStorageJsonTestSuite_LookupRegistrar_Test::
~PersistentStorageJsonTestSuite_LookupRegistrar_Test
          (PersistentStorageJsonTestSuite_LookupRegistrar_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, LookupRegistrar)
{
    // Make test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    //  Populate storage with test data
    RegistrarId newId;

    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.1", 1, {"dom1"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.2", 1, {"dom2"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.3", 3, {"dom3"}}, newId) == PersistentStorage::Status::kSuccess);

    // Test actions
    std::vector<Registrar> retLookup;

    Registrar searchReq{EMPTY_ID, "", 0, {}};
    EXPECT_TRUE(psj.Lookup(searchReq, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 3);

    retLookup.clear();

    searchReq.mId.mId = 0;
    EXPECT_TRUE(psj.Lookup(searchReq, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 1);
    EXPECT_TRUE(retLookup[0].mId.mId == 0);

    retLookup.clear();

    searchReq.mId.mId = 0;
    searchReq.mAddr   = "0.0.0.2";
    EXPECT_TRUE(psj.Lookup(searchReq, retLookup) == PersistentStorage::Status::kNotFound);
    EXPECT_TRUE(retLookup.size() == 0);

    retLookup.clear();

    searchReq.mId.mId = 0;
    searchReq.mAddr   = "0.0.0.1";
    EXPECT_TRUE(psj.Lookup(searchReq, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 1);
    EXPECT_TRUE(retLookup[0].mId.mId == 0);

    retLookup.clear();

    searchReq.mId.mId = 0;
    searchReq.mAddr   = "0.0.0.1";
    searchReq.mPort   = 1;
    EXPECT_TRUE(psj.Lookup(searchReq, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 1);
    EXPECT_TRUE(retLookup[0].mId.mId == 0);

    retLookup.clear();

    searchReq.mId.mId  = 0;
    searchReq.mAddr    = "0.0.0.1";
    searchReq.mPort    = 1;
    searchReq.mDomains = {"dom1"};
    EXPECT_TRUE(psj.Lookup(searchReq, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 1);
    EXPECT_TRUE(retLookup[0].mId.mId == 0);

    retLookup.clear();

    searchReq       = {};
    searchReq.mPort = 1;
    EXPECT_TRUE(psj.Lookup(searchReq, retLookup) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(retLookup.size() == 2);
    EXPECT_TRUE(retLookup[0].mId.mId == 0);
    EXPECT_TRUE(retLookup[1].mId.mId == 1);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}